

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O1

EGUI_BUTTON_IMAGE_STATE __thiscall
irr::gui::CGUIButton::getImageState(CGUIButton *this,bool pressed)

{
  byte bVar1;
  char cVar2;
  EGUI_BUTTON_IMAGE_STATE EVar3;
  CGUIButton *pCVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  
  bVar1 = (**(code **)(**(long **)&this->field_0x128 + 0x28))(*(long **)&this->field_0x128,this,0);
  pCVar4 = (CGUIButton *)(**(code **)(**(long **)&this->field_0x128 + 0x18))();
  cVar2 = (**(code **)(*(long *)this + 0x90))(this);
  uVar5 = 8;
  if (cVar2 != '\0') {
    bVar6 = pCVar4 == this & bVar1;
    if (pressed) {
      uVar5 = 7;
      if (bVar6 != 0) goto LAB_00211ff6;
      uVar7 = (ulong)(pCVar4 == this | 4);
      uVar5 = 6;
    }
    else {
      uVar5 = 3;
      if (bVar6 != 0) goto LAB_00211ff6;
      uVar7 = (ulong)(pCVar4 == this);
      uVar5 = 2;
    }
    if (bVar1 == 0) {
      uVar5 = uVar7;
    }
  }
LAB_00211ff6:
  EVar3 = (EGUI_BUTTON_IMAGE_STATE)uVar5;
  if (EVar3 != EGBIS_IMAGE_UP) {
    do {
      if (this->ButtonImages[uVar5].Texture != (ITexture *)0x0) {
        return (EGUI_BUTTON_IMAGE_STATE)uVar5;
      }
      switch((EGUI_BUTTON_IMAGE_STATE)uVar5) {
      case EGBIS_IMAGE_UP_FOCUSED:
        uVar5 = 1;
        break;
      case EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER:
        uVar5 = 2;
        break;
      default:
        uVar5 = 0;
        break;
      case EGBIS_IMAGE_DOWN_MOUSEOVER:
        uVar5 = 4;
        break;
      case EGBIS_IMAGE_DOWN_FOCUSED:
        uVar5 = 5;
        break;
      case EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER:
        uVar5 = 6;
        break;
      case EGBIS_IMAGE_DISABLED:
        uVar5 = (ulong)pressed << 2;
      }
      EVar3 = (EGUI_BUTTON_IMAGE_STATE)uVar5;
    } while (EVar3 != EGBIS_IMAGE_UP);
  }
  return EVar3;
}

Assistant:

EGUI_BUTTON_IMAGE_STATE CGUIButton::getImageState(bool pressed) const
{
	// figure state we should have
	EGUI_BUTTON_IMAGE_STATE state = EGBIS_IMAGE_DISABLED;
	bool focused = Environment->hasFocus(this);
	bool mouseOver = static_cast<const IGUIElement *>(Environment->getHovered()) == this; // (static cast for Borland)
	if (isEnabled()) {
		if (pressed) {
			if (focused && mouseOver)
				state = EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_DOWN_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			else
				state = EGBIS_IMAGE_DOWN;
		} else // !pressed
		{
			if (focused && mouseOver)
				state = EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_UP_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_UP_MOUSEOVER;
			else
				state = EGBIS_IMAGE_UP;
		}
	}

	// find a compatible state that has images
	while (state != EGBIS_IMAGE_UP && !ButtonImages[(u32)state].Texture) {
		switch (state) {
		case EGBIS_IMAGE_UP_FOCUSED:
			state = EGBIS_IMAGE_UP_MOUSEOVER;
			break;
		case EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_UP_FOCUSED;
			break;
		case EGBIS_IMAGE_DOWN_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED:
			state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN_FOCUSED;
			break;
		case EGBIS_IMAGE_DISABLED:
			if (pressed)
				state = EGBIS_IMAGE_DOWN;
			else
				state = EGBIS_IMAGE_UP;
			break;
		default:
			state = EGBIS_IMAGE_UP;
		}
	}

	return state;
}